

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  CURLcode CVar1;
  uchar *dest;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uchar lastQuantum [3];
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  lVar3 = 0;
  do {
    if (src[lVar3] == '\0') {
      uVar5 = 0;
LAB_0010adde:
      CVar1 = CURLE_OK;
      if (3 < lVar3 + uVar5) {
        uVar4 = lVar3 + uVar5 >> 2;
        sVar2 = uVar4 * 3 - uVar5;
        dest = (uchar *)(*Curl_cmalloc)(sVar2 + 4);
        if (dest == (uchar *)0x0) {
          CVar1 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *outptr = dest;
          while (uVar4 = uVar4 - 1, uVar4 != 0) {
            decodeQuantum(dest,src);
            dest = dest + 3;
            src = src + 4;
          }
          decodeQuantum(lastQuantum,src);
          for (uVar4 = 0; (uVar5 ^ 3) != uVar4; uVar4 = uVar4 + 1) {
            dest[uVar4] = lastQuantum[uVar4];
          }
          dest[uVar5 ^ 3] = '\0';
          *outlen = sVar2;
          CVar1 = CURLE_OK;
        }
      }
      return CVar1;
    }
    if (src[lVar3] == '=') {
      uVar5 = (ulong)(src[lVar3 + 1] == '=') + 1;
      goto LAB_0010adde;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t length = 0;
  size_t equalsTerm = 0;
  size_t i;
  size_t numQuantums;
  unsigned char lastQuantum[3];
  size_t rawlen = 0;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;

  while((src[length] != '=') && src[length])
    length++;
  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    equalsTerm++;
    if(src[length+equalsTerm] == '=')
      equalsTerm++;
  }
  numQuantums = (length + equalsTerm) / 4;

  /* Don't allocate a buffer if the decoded length is 0 */
  if(numQuantums == 0)
    return CURLE_OK;

  rawlen = (numQuantums * 3) - equalsTerm;

  /* The buffer must be large enough to make room for the last quantum
  (which may be partially thrown out) and the zero terminator. */
  newstr = malloc(rawlen+4);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  *outptr = newstr;

  /* Decode all but the last quantum (which may not decode to a
  multiple of 3 bytes) */
  for(i = 0; i < numQuantums - 1; i++) {
    decodeQuantum(newstr, src);
    newstr += 3; src += 4;
  }

  /* This final decode may actually read slightly past the end of the buffer
  if the input string is missing pad bytes.  This will almost always be
  harmless. */
  decodeQuantum(lastQuantum, src);
  for(i = 0; i < 3 - equalsTerm; i++)
    newstr[i] = lastQuantum[i];

  newstr[i] = '\0'; /* zero terminate */

  *outlen = rawlen; /* return size of decoded data */

  return CURLE_OK;
}